

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase347::run(TestCase347 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  bool recovered;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator<char> local_1f9;
  MockExceptionCallback mockCallback;
  bool local_1c0;
  string local_1b8;
  string text;
  char *str;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  i = 0x7b;
  str = "foo";
  paVar2 = &text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  text._M_dataplus._M_p = (pointer)paVar2;
  MockExceptionCallback::MockExceptionCallback(&mockCallback);
  piVar4 = __errno_location();
  *piVar4 = 0;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  mockCallback.text.field_2._M_local_buf[0] = ::std::operator==(&text,"");
  mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)0x1cf111;
  mockCallback.text._M_dataplus._M_p = " == ";
  mockCallback.text._M_string_length = 5;
  mockCallback.super_ExceptionCallback.next = (ExceptionCallback *)&text;
  if ((!(bool)mockCallback.text.field_2._M_local_buf[0]) && (Debug::minSeverity < 3)) {
    Debug::
    log<char_const(&)[32],kj::_::DebugComparison<char_const(&)[1],std::__cxx11::string&>&,char_const(&)[1],std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (text)\", _kjCondition, \"\", text",
               (char (*) [32])"failed: expected (\"\") == (text)",
               (DebugComparison<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&mockCallback,(char (*) [1])0x1cf111,&text);
  }
  ::std::__cxx11::string::~string((string *)&text);
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  text._M_dataplus._M_p = (pointer)paVar2;
  MockExceptionCallback::MockExceptionCallback(&mockCallback);
  do {
    *piVar4 = 9;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x167,iVar3,"mockSyscall(-1, EBADF)","i, \"bar\", str",&i,(char (*) [4])0x1b5691,
               &str);
    Debug::Fault::fatal((Fault *)&local_288);
  }
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x167,ERROR,"\"expected exception\"",(char (*) [19])"expected exception");
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,(allocator<char> *)&recovered);
  fileLine(&local_1b8,&local_50,0x167);
  ::std::operator+(&local_260,"fatal exception: ",&local_1b8);
  ::std::operator+(&local_240,&local_260,": failed: mockSyscall(-1, EBADF): ");
  pcVar5 = strerror(9);
  ::std::operator+(&local_220,&local_240,pcVar5);
  ::std::operator+(&local_2a8,&local_220,"; i = 123; bar; str = foo\n");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  paVar1 = &local_2a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar1) {
    local_288.field_2._8_8_ = local_2a8.field_2._8_8_;
  }
  else {
    local_288._M_dataplus._M_p = local_2a8._M_dataplus._M_p;
  }
  local_288._M_string_length = local_2a8._M_string_length;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&mockCallback,(DebugExpression<std::__cxx11::string> *)&local_288,&text);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::__cxx11::string::~string((string *)&local_240);
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_50);
  if ((local_1c0 == false) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,(allocator<char> *)&local_1b8);
    fileLine(&local_260,&local_70,0x167);
    ::std::operator+(&local_240,"fatal exception: ",&local_260);
    ::std::operator+(&local_220,&local_240,": failed: mockSyscall(-1, EBADF): ");
    pcVar5 = strerror(9);
    ::std::operator+(&local_2a8,&local_220,pcVar5);
    ::std::operator+(&local_288,&local_2a8,"; i = 123; bar; str = foo\n");
    Debug::
    log<char_const(&)[256],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x16c,ERROR,
               "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": failed: mockSyscall(-1, EBADF): \\\" + strerror(9) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-1, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [256])
                "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-1, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_288,&text);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_2a8);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  ::std::__cxx11::string::~string((string *)&mockCallback);
  ::std::__cxx11::string::~string((string *)&text);
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  text._M_dataplus._M_p = (pointer)paVar2;
  MockExceptionCallback::MockExceptionCallback(&mockCallback);
  do {
    *piVar4 = 0x68;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x16f,iVar3,"mockSyscall(-1, ECONNRESET)","i, \"bar\", str",&i,
               (char (*) [4])0x1b5691,&str);
    Debug::Fault::fatal((Fault *)&local_288);
  }
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x16f,ERROR,"\"expected exception\"",(char (*) [19])"expected exception");
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,(allocator<char> *)&recovered);
  fileLine(&local_1b8,&local_90,0x16f);
  ::std::operator+(&local_260,"fatal exception: ",&local_1b8);
  ::std::operator+(&local_240,&local_260,": disconnected: mockSyscall(-1, ECONNRESET): ");
  pcVar5 = strerror(0x68);
  ::std::operator+(&local_220,&local_240,pcVar5);
  ::std::operator+(&local_2a8,&local_220,"; i = 123; bar; str = foo\n");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar1) {
    local_288.field_2._8_8_ = local_2a8.field_2._8_8_;
  }
  else {
    local_288._M_dataplus._M_p = local_2a8._M_dataplus._M_p;
  }
  local_288.field_2._M_allocated_capacity._1_7_ = local_2a8.field_2._M_allocated_capacity._1_7_;
  local_288.field_2._M_local_buf[0] = local_2a8.field_2._M_local_buf[0];
  local_288._M_string_length = local_2a8._M_string_length;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&mockCallback,(DebugExpression<std::__cxx11::string> *)&local_288,&text);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::__cxx11::string::~string((string *)&local_240);
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_90);
  if ((local_1c0 == false) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,(allocator<char> *)&local_1b8);
    fileLine(&local_260,&local_b0,0x16f);
    ::std::operator+(&local_240,"fatal exception: ",&local_260);
    ::std::operator+(&local_220,&local_240,": disconnected: mockSyscall(-1, ECONNRESET): ");
    pcVar5 = strerror(0x68);
    ::std::operator+(&local_2a8,&local_220,pcVar5);
    ::std::operator+(&local_288,&local_2a8,"; i = 123; bar; str = foo\n");
    Debug::
    log<char_const(&)[269],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x174,ERROR,
               "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": disconnected: mockSyscall(-1, ECONNRESET): \\\" + strerror(104) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": disconnected: mockSyscall(-1, ECONNRESET): \" + strerror(104) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [269])
                "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": disconnected: mockSyscall(-1, ECONNRESET): \" + strerror(104) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_288,&text);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_2a8);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  ::std::__cxx11::string::~string((string *)&mockCallback);
  ::std::__cxx11::string::~string((string *)&text);
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  text._M_dataplus._M_p = (pointer)paVar2;
  MockExceptionCallback::MockExceptionCallback(&mockCallback);
  do {
    *piVar4 = 0xc;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x177,iVar3,"mockSyscall(-1, ENOMEM)","i, \"bar\", str",&i,(char (*) [4])0x1b5691,
               &str);
    Debug::Fault::fatal((Fault *)&local_288);
  }
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x177,ERROR,"\"expected exception\"",(char (*) [19])"expected exception");
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,(allocator<char> *)&recovered);
  fileLine(&local_1b8,&local_d0,0x177);
  ::std::operator+(&local_260,"fatal exception: ",&local_1b8);
  ::std::operator+(&local_240,&local_260,": overloaded: mockSyscall(-1, ENOMEM): ");
  pcVar5 = strerror(0xc);
  ::std::operator+(&local_220,&local_240,pcVar5);
  ::std::operator+(&local_2a8,&local_220,"; i = 123; bar; str = foo\n");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar1) {
    local_288.field_2._8_8_ = local_2a8.field_2._8_8_;
  }
  else {
    local_288._M_dataplus._M_p = local_2a8._M_dataplus._M_p;
  }
  local_288.field_2._M_allocated_capacity._1_7_ = local_2a8.field_2._M_allocated_capacity._1_7_;
  local_288.field_2._M_local_buf[0] = local_2a8.field_2._M_local_buf[0];
  local_288._M_string_length = local_2a8._M_string_length;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&mockCallback,(DebugExpression<std::__cxx11::string> *)&local_288,&text);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::__cxx11::string::~string((string *)&local_240);
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_d0);
  if ((local_1c0 == false) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,(allocator<char> *)&local_1b8);
    fileLine(&local_260,&local_f0,0x177);
    ::std::operator+(&local_240,"fatal exception: ",&local_260);
    ::std::operator+(&local_220,&local_240,": overloaded: mockSyscall(-1, ENOMEM): ");
    pcVar5 = strerror(0xc);
    ::std::operator+(&local_2a8,&local_220,pcVar5);
    ::std::operator+(&local_288,&local_2a8,"; i = 123; bar; str = foo\n");
    Debug::
    log<char_const(&)[262],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x17c,ERROR,
               "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": overloaded: mockSyscall(-1, ENOMEM): \\\" + strerror(12) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": overloaded: mockSyscall(-1, ENOMEM): \" + strerror(12) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [262])
                "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": overloaded: mockSyscall(-1, ENOMEM): \" + strerror(12) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_288,&text);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_2a8);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::string::~string((string *)&local_f0);
  }
  ::std::__cxx11::string::~string((string *)&mockCallback);
  ::std::__cxx11::string::~string((string *)&text);
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  text._M_dataplus._M_p = (pointer)paVar2;
  MockExceptionCallback::MockExceptionCallback(&mockCallback);
  do {
    *piVar4 = 0x26;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x17f,iVar3,"mockSyscall(-1, ENOSYS)","i, \"bar\", str",&i,(char (*) [4])0x1b5691,
               &str);
    Debug::Fault::fatal((Fault *)&local_288);
  }
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x17f,ERROR,"\"expected exception\"",(char (*) [19])"expected exception");
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,(allocator<char> *)&recovered);
  fileLine(&local_1b8,&local_110,0x17f);
  ::std::operator+(&local_260,"fatal exception: ",&local_1b8);
  ::std::operator+(&local_240,&local_260,": unimplemented: mockSyscall(-1, ENOSYS): ");
  pcVar5 = strerror(0x26);
  ::std::operator+(&local_220,&local_240,pcVar5);
  ::std::operator+(&local_2a8,&local_220,"; i = 123; bar; str = foo\n");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar1) {
    local_288.field_2._8_8_ = local_2a8.field_2._8_8_;
  }
  else {
    local_288._M_dataplus._M_p = local_2a8._M_dataplus._M_p;
  }
  local_288.field_2._M_allocated_capacity._1_7_ = local_2a8.field_2._M_allocated_capacity._1_7_;
  local_288.field_2._M_local_buf[0] = local_2a8.field_2._M_local_buf[0];
  local_288._M_string_length = local_2a8._M_string_length;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&mockCallback,(DebugExpression<std::__cxx11::string> *)&local_288,&text);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::__cxx11::string::~string((string *)&local_240);
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_110);
  if ((local_1c0 == false) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,(allocator<char> *)&local_1b8);
    fileLine(&local_260,&local_130,0x17f);
    ::std::operator+(&local_240,"fatal exception: ",&local_260);
    ::std::operator+(&local_220,&local_240,": unimplemented: mockSyscall(-1, ENOSYS): ");
    pcVar5 = strerror(0x26);
    ::std::operator+(&local_2a8,&local_220,pcVar5);
    ::std::operator+(&local_288,&local_2a8,"; i = 123; bar; str = foo\n");
    Debug::
    log<char_const(&)[265],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x184,ERROR,
               "\"failed: expected \" \"(( \\\"fatal exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": unimplemented: mockSyscall(-1, ENOSYS): \\\" + strerror(38) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": unimplemented: mockSyscall(-1, ENOSYS): \" + strerror(38) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [265])
                "failed: expected (( \"fatal exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": unimplemented: mockSyscall(-1, ENOSYS): \" + strerror(38) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_288,&text);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_2a8);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::string::~string((string *)&local_130);
  }
  ::std::__cxx11::string::~string((string *)&mockCallback);
  ::std::__cxx11::string::~string((string *)&text);
  recovered = false;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  text._M_dataplus._M_p = (pointer)paVar2;
  MockExceptionCallback::MockExceptionCallback(&mockCallback);
  do {
    *piVar4 = 9;
    iVar3 = Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    Debug::Fault::Fault<int,int&,char_const(&)[4],char_const*&>
              ((Fault *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x189,iVar3,"result = mockSyscall(-2, EBADF)","i, \"bar\", str",&i,
               (char (*) [4])0x1b5691,&str);
    recovered = true;
    Debug::Fault::~Fault((Fault *)&local_288);
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&text,&mockCallback.text);
  MockExceptionCallback::~MockExceptionCallback(&mockCallback);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_1f9);
  fileLine(&local_1b8,&local_150,0x189);
  ::std::operator+(&local_260,"recoverable exception: ",&local_1b8);
  ::std::operator+(&local_240,&local_260,": failed: mockSyscall(-2, EBADF): ");
  pcVar5 = strerror(9);
  ::std::operator+(&local_220,&local_240,pcVar5);
  ::std::operator+(&local_2a8,&local_220,"; i = 123; bar; str = foo\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar1) {
    local_288.field_2._8_8_ = local_2a8.field_2._8_8_;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288._M_dataplus._M_p = local_2a8._M_dataplus._M_p;
  }
  local_288.field_2._M_allocated_capacity._1_7_ = local_2a8.field_2._M_allocated_capacity._1_7_;
  local_288.field_2._M_local_buf[0] = local_2a8.field_2._M_local_buf[0];
  local_288._M_string_length = local_2a8._M_string_length;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  DebugExpression<std::__cxx11::string>::operator==
            ((DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&mockCallback,(DebugExpression<std::__cxx11::string> *)&local_288,&text);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::__cxx11::string::~string((string *)&local_240);
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_150);
  if ((local_1c0 == false) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,(allocator<char> *)&local_1b8);
    fileLine(&local_260,&local_170,0x189);
    ::std::operator+(&local_240,"recoverable exception: ",&local_260);
    ::std::operator+(&local_220,&local_240,": failed: mockSyscall(-2, EBADF): ");
    pcVar5 = strerror(9);
    ::std::operator+(&local_2a8,&local_220,pcVar5);
    ::std::operator+(&local_288,&local_2a8,"; i = 123; bar; str = foo\n");
    Debug::
    log<char_const(&)[262],kj::_::DebugComparison<std::__cxx11::string,std::__cxx11::string&>&,std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,0x18e,ERROR,
               "\"failed: expected \" \"(( \\\"recoverable exception: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\": failed: mockSyscall(-2, EBADF): \\\" + strerror(9) + \\\"; i = 123; bar; str = foo\\\\n\\\" )) == (text)\", _kjCondition, ( \"recoverable exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-2, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" ), text"
               ,(char (*) [262])
                "failed: expected (( \"recoverable exception: \" + fileLine(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++\", line) + \": failed: mockSyscall(-2, EBADF): \" + strerror(9) + \"; i = 123; bar; str = foo\\n\" )) == (text)"
               ,(DebugComparison<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&mockCallback,&local_288,&text);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_2a8);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::string::~string((string *)&local_170);
  }
  ::std::__cxx11::string::~string((string *)&mockCallback);
  ::std::__cxx11::string::~string((string *)&text);
  if (iVar3 == 0 && Debug::minSeverity < 3) {
    mockCallback.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&recovered;
    Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug-test.c++"
               ,400,ERROR,"\"failed: expected \" \"recovered\", _kjCondition",
               (char (*) [27])"failed: expected recovered",(DebugExpression<bool_&> *)&mockCallback)
    ;
  }
  return;
}

Assistant:

TEST(Debug, Syscall) {
  int line;

  int i = 123;
  const char* str = "foo";

  EXPECT_LOG_EQ([&](){
    KJ_SYSCALL(mockSyscall(0));
    KJ_SYSCALL(mockSyscall(1));
  }, "");

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, EBADF), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": failed: mockSyscall(-1, EBADF): " + strerror(EBADF) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ECONNRESET), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": disconnected: mockSyscall(-1, ECONNRESET): " + strerror(ECONNRESET) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ENOMEM), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": overloaded: mockSyscall(-1, ENOMEM): " + strerror(ENOMEM) +
        "; i = 123; bar; str = foo\n"
  ));

  EXPECT_LOG_EQ([&](){
    EXPECT_FATAL(KJ_SYSCALL(mockSyscall(-1, ENOSYS), i, "bar", str)); line = __LINE__;
  }, (
    "fatal exception: " + fileLine(__FILE__, line) +
        ": unimplemented: mockSyscall(-1, ENOSYS): " + strerror(ENOSYS) +
        "; i = 123; bar; str = foo\n"
  ));

  int result = 0;
  bool recovered = false;
  EXPECT_LOG_EQ([&](){
    KJ_SYSCALL(result = mockSyscall(-2, EBADF), i, "bar", str) { recovered = true; break; } line = __LINE__;
  }, (
    "recoverable exception: " + fileLine(__FILE__, line) +
        ": failed: mockSyscall(-2, EBADF): " + strerror(EBADF) +
        "; i = 123; bar; str = foo\n"
  ));
  EXPECT_EQ(-2, result);
  EXPECT_TRUE(recovered);
}